

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
::operator()(make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
             *this,stringstream *msg,char *arg,path args,char *args_1,fpos<__mbstate_t> args_2,
            char *args_3,fpos<__mbstate_t> args_4)

{
  path arg_00;
  fpos<__mbstate_t> args_1_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  fpos<__mbstate_t> in_stack_ffffffffffffffb0;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffffb0,(path *)args_1);
  arg_00._M_pathname._M_string_length = args._M_pathname.field_2._M_allocated_capacity;
  arg_00._M_pathname._M_dataplus._M_p = (pointer)args_2._M_state;
  arg_00._M_pathname.field_2._M_allocated_capacity = args._M_pathname.field_2._8_8_;
  arg_00._24_16_ = in_stack_ffffffffffffffa0;
  args_1_00._M_state = (__mbstate_t)args._M_pathname._M_dataplus._M_p;
  args_1_00._M_off = args_2._M_off;
  make_exception<std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
  ::operator()((make_exception<std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
                *)&stack0xffffffffffffffaf,msg,arg_00,(char *)&stack0xffffffffffffffb0,args_1_00,
               (char *)args._M_pathname._M_string_length,in_stack_ffffffffffffffb0);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }